

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O3

void __thiscall VGMPlayer::InitDevices(VGMPlayer *this)

{
  RESMPL_STATE *CAA;
  INT16 *pIVar1;
  pointer *ppCVar2;
  QSOUND_WORK *pQVar3;
  UINT16 *pUVar4;
  byte bVar5;
  UINT32 UVar6;
  DEV_GEN_CFG *cfg;
  undefined8 uVar7;
  DEVFUNC_OPTMASK p_Var8;
  iterator __position;
  DEVFUNC_SETLOGCB p_Var9;
  bool bVar10;
  VGM_BASEDEV *pVVar11;
  UINT8 UVar12;
  UINT16 UVar13;
  uint uVar14;
  UINT32 UVar15;
  long lVar16;
  char *pcVar17;
  long lVar18;
  size_t sVar19;
  pointer pCVar20;
  byte bVar21;
  code *pcVar22;
  UINT8 UVar23;
  pointer pSVar24;
  VGMPlayer *this_00;
  DEVFUNC_WRITE_A16D16 *pp_Var25;
  DEVFUNC_WRITE_BLOCK *retFuncPtr;
  ulong uVar26;
  VGM_BASEDEV *clDev;
  CHIP_DEVICE *pCVar27;
  SN76496_CFG *snCfg;
  pointer pCVar28;
  PLR_DEV_OPTS *devOpts;
  string devName;
  char postFix [16];
  CHIP_DEVICE local_198;
  QSOUND_WORK *local_a8;
  vector<VGMPlayer::CHIP_DEVICE,std::allocator<VGMPlayer::CHIP_DEVICE>> *local_a0;
  size_t (*local_98) [2];
  PLR_DEV_OPTS *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  size_t (*local_80) [2];
  PLR_DEV_OPTS *local_78;
  size_t local_70;
  value_type local_68;
  VGMPlayer *local_48;
  pointer local_40;
  CHIP_DEVICE *local_38;
  
  memset(this->_shownCmdWarnings,0,0x100);
  pCVar20 = (this->_devices).
            super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devices).
      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar20) {
    (this->_devices).
    super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar20;
  }
  local_88 = &this->_devNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_88,(this->_devNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_98 = this->_vdDevMap;
  memset(local_98,0xff,0x540);
  bVar5 = this->_p2612Fix;
  bVar21 = bVar5 & 0x7e;
  if ((char)bVar5 < '\0') {
    bVar21 = bVar5 | 1;
  }
  this->_p2612Fix = bVar21;
  pSVar24 = (this->_devCfgs).
            super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devCfgs).
      super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar24) {
    local_a0 = (vector<VGMPlayer::CHIP_DEVICE,std::allocator<VGMPlayer::CHIP_DEVICE>> *)
               &this->_devices;
    local_80 = this->_devOptMap;
    local_90 = this->_devOpts;
    local_a8 = this->_qsWork;
    uVar26 = 0;
    do {
      bVar5 = pSVar24[uVar26].type;
      bVar21 = pSVar24[uVar26].instance;
      cfg = (DEV_GEN_CFG *)
            pSVar24[uVar26].cfgData.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      memset(&local_198,0,0xf0);
      pSVar24[uVar26].deviceID = 0xffffffffffffffff;
      local_198.vgmChipType = pSVar24[uVar26].vgmChipType;
      local_198.chipType = pSVar24[uVar26].type;
      local_198.optID = local_80[bVar5][bVar21];
      local_198.base.linkDev = (VGM_BASEDEV *)0x0;
      devOpts = local_90 + local_198.optID;
      if (local_198.optID == 0xffffffffffffffff) {
        cfg->emuCore = 0;
        cfg->srMode = '\0';
        UVar15 = 0;
        local_78 = (PLR_DEV_OPTS *)0x0;
LAB_0011c9fa:
        UVar6 = (this->super_PlayerBase)._outSmplRate;
      }
      else {
        UVar15 = devOpts->emuCore[0];
        cfg->emuCore = UVar15;
        cfg->srMode = devOpts->srMode;
        UVar6 = devOpts->smplRate;
        local_78 = devOpts;
        if (UVar6 == 0) goto LAB_0011c9fa;
      }
      cfg->smplRate = UVar6;
      local_198.chipID = bVar21;
      local_198.cfgID = uVar26;
      local_70 = local_198.optID;
      if (bVar5 < 0x15) {
        switch(bVar5) {
        case 0:
          if (((((bVar21 & 1) != 0) && (cfg->flags != '\0')) &&
              (bVar21 < 2 && local_198.vgmChipType < 0x2a)) &&
             ((local_98[local_198.vgmChipType][0] != 0xffffffffffffffff &&
              (lVar18 = *(long *)local_a0, lVar18 != 0)))) {
            lVar16 = local_98[local_198.vgmChipType][0] * 0xf0;
            uVar7 = *(undefined8 *)(lVar18 + lVar16);
            cfg[1].clock = (int)uVar7;
            cfg[1].smplRate = (int)((ulong)uVar7 >> 0x20);
            UVar15 = *(UINT32 *)(*(long *)(lVar18 + 0x10 + lVar16) + 0x10);
            cfg->emuCore = UVar15;
          }
          if (UVar15 == 0) {
            cfg->emuCore = 0x4d414d45;
          }
          UVar12 = SndEmu_Start('\0',cfg,(DEV_INFO *)&local_198);
          if (UVar12 != '\0') break;
          UVar23 = '\0';
          UVar12 = '\x11';
          UVar13 = 0;
          retFuncPtr = (DEVFUNC_WRITE_BLOCK *)&local_198.write8;
          goto LAB_0011d07f;
        case 2:
          uVar14 = (uint)cfg->flags;
LAB_0011cdb6:
          local_198.flags = uVar14;
        case 1:
        case 3:
        case 4:
        case 6:
        case 7:
switchD_0011ca27_caseD_1:
          UVar12 = SndEmu_Start(bVar5,cfg,(DEV_INFO *)&local_198);
          if (UVar12 == '\0') {
            SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\0','\x11',0,&local_198.write8);
            UVar12 = '!';
            pp_Var25 = (DEVFUNC_WRITE_A16D16 *)&local_198.writeM8;
LAB_0011d043:
            SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\0',UVar12,0,pp_Var25);
            UVar23 = '\x10';
            UVar12 = 0x81;
            pp_Var25 = (DEVFUNC_WRITE_A16D16 *)&local_198.romSize;
LAB_0011d061:
            SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,UVar23,UVar12,0,pp_Var25);
            UVar23 = '\x10';
            UVar12 = 0x80;
            UVar13 = 0;
            retFuncPtr = &local_198.romWrite;
LAB_0011d07f:
            SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,UVar23,UVar12,UVar13,retFuncPtr);
LAB_0011d092:
            pSVar24 = pSVar24 + uVar26;
            pSVar24->deviceID =
                 ((long)(this->_devices).
                        super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_devices).
                        super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x1111111111111111;
            pcVar17 = SndEmu_GetDevName(bVar5,'\0',cfg);
            std::__cxx11::string::string((string *)&local_68,pcVar17,(allocator *)&local_48);
            UVar15 = GetHeaderChipClock(this,pSVar24->vgmChipType);
            if ((UVar15 >> 0x1e & 1) != 0) {
              snprintf((char *)&local_48,0x10," #%u",(ulong)(bVar21 + 1));
              std::__cxx11::string::append((char *)&local_68);
            }
            local_198.logCbData.chipDevID =
                 ((long)(this->_devices).
                        super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_devices).
                        super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x1111111111111111;
            local_198.logCbData.player = this;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_88,&local_68);
            local_38 = &local_198;
            local_48 = this;
            local_40 = pSVar24;
            if ((local_198.base.defInf.devDef)->SetLogCB != (DEVFUNC_SETLOGCB)0x0) {
              (*(local_198.base.defInf.devDef)->SetLogCB)
                        (local_198.base.defInf.dataPtr,SndEmuLogCB,&local_198.logCbData);
            }
            SetupLinkedDevices(&local_198.base,DeviceLinkCallback,(allocator *)&local_48);
            if (local_70 != 0xffffffffffffffff) {
              RefreshDevOptions(this,&local_198,devOpts);
              bVar5 = 1;
              lVar18 = 0;
              pCVar27 = &local_198;
              do {
                this_00 = (VGMPlayer *)(pCVar27->base).defInf.dataPtr;
                if ((this_00 != (VGMPlayer *)0x0) &&
                   (p_Var8 = ((pCVar27->base).defInf.devDef)->SetMuteMask,
                   p_Var8 != (DEVFUNC_OPTMASK)0x0)) {
                  (*p_Var8)(this_00,(devOpts->muteOpts).chnMute[lVar18]);
                }
                pCVar27 = (CHIP_DEVICE *)(pCVar27->base).linkDev;
                lVar18 = 1;
                bVar10 = (bool)(bVar5 & pCVar27 != (CHIP_DEVICE *)0x0);
                bVar5 = 0;
              } while (bVar10);
              RefreshPanning(this_00,&local_198,&local_78->panOpts);
            }
            pVVar11 = local_198.base.linkDev;
            if ((((local_198.base.defInf.linkDevCount != 0) &&
                 ((local_198.base.defInf.linkDevs)->devID == '\x12')) &&
                (sVar19 = DeviceID2OptionID(this,(uint)bVar21 << 0x10 | 0x80000012),
                pVVar11 != (VGM_BASEDEV *)0x0 && sVar19 != 0xffffffffffffffff)) &&
               (p_Var8 = ((pVVar11->defInf).devDef)->SetOptionBits, p_Var8 != (DEVFUNC_OPTMASK)0x0))
            {
              (*p_Var8)(local_198.base.defInf.dataPtr,local_90[sVar19].coreOpts);
            }
            __position._M_current =
                 (this->_devices).
                 super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            sVar19 = ((long)__position._M_current -
                      (long)(this->_devices).
                            super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x1111111111111111;
            local_98[pSVar24->vgmChipType][bVar21] = sVar19;
            if (local_198.optID != 0xffffffffffffffff) {
              this->_optDevMap[local_198.optID] = sVar19;
            }
            if (__position._M_current ==
                (this->_devices).
                super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<VGMPlayer::CHIP_DEVICE,std::allocator<VGMPlayer::CHIP_DEVICE>>::
              _M_realloc_insert<VGMPlayer::CHIP_DEVICE_const&>(local_a0,__position,&local_198);
            }
            else {
              memcpy(__position._M_current,&local_198,0xf0);
              ppCVar2 = &(this->_devices).
                         super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppCVar2 = *ppCVar2 + 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
          }
          break;
        case 5:
          if (UVar15 == 0) {
            UVar15 = 0x4d414d45;
            if (cfg->flags == '\x01') {
              UVar15 = 0x47454e53;
            }
            cfg->emuCore = UVar15;
          }
          UVar12 = SndEmu_Start('\x05',cfg,(DEV_INFO *)&local_198);
          if (UVar12 == '\0') {
            SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\0','\x11',0,&local_198.write8);
            UVar23 = '\x10';
            UVar12 = '!';
            pp_Var25 = (DEVFUNC_WRITE_A16D16 *)&local_198.writeM8;
            goto LAB_0011d061;
          }
          break;
        case 8:
          UVar12 = SndEmu_Start('\b',cfg,(DEV_INFO *)&local_198);
          if (UVar12 == '\0') {
            SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\0','\x11',0,&local_198.write8);
            SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\x10',0x81,0x41,&local_198.romSize);
            SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\x10',0x80,0x41,&local_198.romWrite);
            SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\x10',0x81,0x42,&local_198.romSizeB);
            UVar23 = '\x10';
            UVar12 = 0x80;
            UVar13 = 0x42;
            retFuncPtr = &local_198.romWriteB;
            goto LAB_0011d07f;
          }
          break;
        default:
          if (bVar5 == 0xd) {
            UVar12 = SndEmu_Start('\r',cfg,(DEV_INFO *)&local_198);
            if (UVar12 == '\0') {
              SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\0','\x11',0,&local_198.write8);
              SndEmu_GetDeviceFunc
                        (local_198.base.defInf.devDef,'\x10',0x81,0x524f,&local_198.romSize);
              SndEmu_GetDeviceFunc
                        (local_198.base.defInf.devDef,'\x10',0x80,0x524f,&local_198.romWrite);
              SndEmu_GetDeviceFunc
                        (local_198.base.defInf.devDef,'\x10',0x81,0x5241,&local_198.romSizeB);
              SndEmu_GetDeviceFunc
                        (local_198.base.defInf.devDef,'\x10',0x80,0x5241,&local_198.romWriteB);
              LoadOPL4ROM(this,&local_198);
              goto LAB_0011d092;
            }
          }
          else {
            if (bVar5 != 0x11) goto switchD_0011ca27_caseD_1;
            UVar12 = SndEmu_Start('\x11',cfg,(DEV_INFO *)&local_198);
            if (UVar12 == '\0') {
              UVar23 = '\0';
              UVar12 = '\x12';
              UVar13 = 0;
              retFuncPtr = (DEVFUNC_WRITE_BLOCK *)&local_198.writeD16;
              goto LAB_0011d07f;
            }
          }
        }
      }
      else {
        switch(bVar5) {
        case 0x1f:
          local_198.flags = 0;
          UVar15 = GetChipClock(this,local_198.vgmChipType,bVar21);
          local_198.flags = (UINT32)((UVar15 & 0x3fffffff) < cfg->clock);
          if (cfg->emuCore == 0) {
            cfg->emuCore = 0x43545200;
          }
          UVar12 = SndEmu_Start('\x1f',cfg,(DEV_INFO *)&local_198);
          if (UVar12 != '\0') break;
          SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\0','\x11',0,&local_198.write8);
          SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\x02','\x12',0,&local_198.writeD16);
          SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\x10',0x81,0,&local_198.romSize);
          SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\x10',0x80,0,&local_198.romWrite);
          pQVar3 = local_a8 + bVar21;
          pQVar3->write = (_func_void_CHIP_DEVICE_ptr_UINT8_UINT16 *)0x0;
          pQVar3->startAddrCache[0] = 0;
          pQVar3->startAddrCache[1] = 0;
          pQVar3->startAddrCache[2] = 0;
          pQVar3->startAddrCache[3] = 0;
          pUVar4 = local_a8[bVar21].startAddrCache + 4;
          pUVar4[0] = 0;
          pUVar4[1] = 0;
          pUVar4[2] = 0;
          pUVar4[3] = 0;
          pUVar4[4] = 0;
          pUVar4[5] = 0;
          pUVar4[6] = 0;
          pUVar4[7] = 0;
          pUVar4 = local_a8[bVar21].startAddrCache + 0xc;
          pUVar4[0] = 0;
          pUVar4[1] = 0;
          pUVar4[2] = 0;
          pUVar4[3] = 0;
          pUVar4[4] = 0;
          pUVar4[5] = 0;
          pUVar4[6] = 0;
          pUVar4[7] = 0;
          pUVar4 = local_a8[bVar21].pitchCache + 4;
          pUVar4[0] = 0;
          pUVar4[1] = 0;
          pUVar4[2] = 0;
          pUVar4[3] = 0;
          pUVar4[4] = 0;
          pUVar4[5] = 0;
          pUVar4[6] = 0;
          pUVar4[7] = 0;
          pQVar3 = local_a8 + bVar21;
          pQVar3->pitchCache[0xc] = 0;
          pQVar3->pitchCache[0xd] = 0;
          pQVar3->pitchCache[0xe] = 0;
          pQVar3->pitchCache[0xf] = 0;
          if ((local_198.base.defInf.devDef)->coreID == 0x4d414d45) {
            local_198.flags = local_198.flags & 0xfffffffe;
          }
          if (local_198.writeD16 == (DEVFUNC_WRITE_A8D16)0x0) {
            if (local_198.write8 == (DEVFUNC_WRITE_A8D8)0x0) {
              local_a8[bVar21].write = (_func_void_CHIP_DEVICE_ptr_UINT8_UINT16 *)0x0;
              goto LAB_0011d092;
            }
            pcVar22 = WriteQSound_B;
          }
          else {
            pcVar22 = WriteQSound_A;
          }
          local_a8[bVar21].write = pcVar22;
          goto LAB_0011d092;
        case 0x20:
          UVar12 = SndEmu_Start(' ',cfg,(DEV_INFO *)&local_198);
          if (UVar12 != '\0') break;
          SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\0','!',0,&local_198.writeM8);
          UVar23 = '\0';
          UVar12 = '\"';
          pp_Var25 = &local_198.writeM16;
          goto LAB_0011d061;
        case 0x21:
          UVar12 = SndEmu_Start('!',cfg,(DEV_INFO *)&local_198);
          if (UVar12 == '\0') {
            SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\0','\x11',0,&local_198.write8);
            UVar23 = '\x10';
            UVar12 = '!';
            UVar13 = 0;
            retFuncPtr = (DEVFUNC_WRITE_BLOCK *)&local_198.writeM8;
            goto LAB_0011d07f;
          }
          break;
        case 0x22:
        case 0x23:
        case 0x24:
        case 0x26:
          goto switchD_0011ca27_caseD_1;
        case 0x25:
          UVar12 = SndEmu_Start('%',cfg,(DEV_INFO *)&local_198);
          if (UVar12 == '\0') {
            SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\0','\x11',0,&local_198.write8);
            UVar23 = '\0';
            UVar12 = '\x12';
            pp_Var25 = (DEVFUNC_WRITE_A16D16 *)&local_198.writeD16;
            goto LAB_0011d061;
          }
          break;
        case 0x27:
          UVar12 = SndEmu_Start('\'',cfg,(DEV_INFO *)&local_198);
          if (UVar12 != '\0') break;
          UVar12 = '\"';
          pp_Var25 = &local_198.writeM16;
          goto LAB_0011d043;
        default:
          if (bVar5 != 0x15) {
            uVar14 = 1;
            if (bVar5 == 0x80) goto LAB_0011cdb6;
            goto switchD_0011ca27_caseD_1;
          }
          UVar12 = SndEmu_Start('\x15',cfg,(DEV_INFO *)&local_198);
          if (UVar12 == '\0') {
            SndEmu_GetDeviceFunc(local_198.base.defInf.devDef,'\0','\x11',0,&local_198.write8);
            UVar12 = '\x12';
            pp_Var25 = (DEVFUNC_WRITE_A16D16 *)&local_198.writeD16;
            goto LAB_0011d043;
          }
        }
      }
      uVar26 = uVar26 + 1;
      pSVar24 = (this->_devCfgs).
                super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar26 < (ulong)(((long)(this->_devCfgs).
                                     super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar24 >> 3
                              ) * -0x3333333333333333));
  }
  pCVar20 = (this->_devices).
            super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devices).
      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar20) {
    uVar26 = 0;
    do {
      pCVar28 = pCVar20 + uVar26;
      sVar19 = pCVar20[uVar26].optID;
      p_Var9 = (pCVar20[uVar26].base.defInf.devDef)->SetLogCB;
      if (p_Var9 != (DEVFUNC_SETLOGCB)0x0) {
        (*p_Var9)((pCVar28->base).defInf.dataPtr,SndEmuLogCB,&pCVar28->logCbData);
      }
      UVar12 = '\0';
      pCVar20 = pCVar28;
      do {
        UVar13 = GetChipVolume(this,pCVar28->vgmChipType,pCVar28->chipID,UVar12);
        if (sVar19 == 0xffffffffffffffff) {
          UVar23 = '\0';
        }
        else {
          UVar23 = this->_devOpts[sVar19].resmplMode;
        }
        CAA = &(pCVar20->base).resmpl;
        Resmpl_SetVals(CAA,UVar23,UVar13,(this->super_PlayerBase)._outSmplRate);
        Resmpl_DevConnect(CAA,(DEV_INFO *)pCVar20);
        Resmpl_Init(CAA);
        pCVar20 = (pointer)(pCVar20->base).linkDev;
        UVar12 = UVar12 + '\x01';
      } while (pCVar20 != (pointer)0x0);
      if (pCVar28->chipType == '\t') {
        bVar5 = pCVar28->chipID;
        UVar15 = GetChipClock(this,pCVar28->vgmChipType,bVar5);
        if ((int)UVar15 < 0) {
          do {
            if ((bVar5 & 1) == 0) {
              pIVar1 = &(pCVar28->base).resmpl.volumeL;
              *pIVar1 = *pIVar1 << 1;
              (pCVar28->base).resmpl.volumeR = 0;
            }
            else {
              (pCVar28->base).resmpl.volumeL = 0;
              pIVar1 = &(pCVar28->base).resmpl.volumeR;
              *pIVar1 = *pIVar1 << 1;
            }
            pCVar28 = (pointer)(pCVar28->base).linkDev;
          } while (pCVar28 != (pointer)0x0);
        }
      }
      uVar26 = uVar26 + 1;
      pCVar20 = (this->_devices).
                super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar26 < (ulong)(((long)(this->_devices).
                                     super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar20 >> 4
                              ) * -0x1111111111111111));
  }
  UVar13 = EstimateOverallVolume(this);
  NormalizeOverallVolume(this,UVar13);
  return;
}

Assistant:

void VGMPlayer::InitDevices(void)
{
	size_t curChip;
	
	memset(_shownCmdWarnings, 0, 0x100);
	
	_devices.clear();
	_devNames.clear();
	{
		UINT8 vgmChip;
		UINT8 chipID;
		for (vgmChip = 0x00; vgmChip < _CHIP_COUNT; vgmChip ++)
		{
			for (chipID = 0; chipID < 2; chipID ++)
				_vdDevMap[vgmChip][chipID] = (size_t)-1;
		}
	}
	for (curChip = 0; curChip < _OPT_DEV_COUNT * 2; curChip ++)
		_optDevMap[curChip] = (size_t)-1;
	
	// When the Project2612 fix is enabled [bit 7], enable it during chip init [bit 0].
	if (_p2612Fix & P2612FIX_ENABLE)
		_p2612Fix |= P2612FIX_ACTIVE;
	else
		_p2612Fix &= ~P2612FIX_ACTIVE;
	
	for (curChip = 0; curChip < _devCfgs.size(); curChip ++)
	{
		SONG_DEV_CFG& sdCfg = _devCfgs[curChip];
		UINT8 chipType = sdCfg.type;
		UINT8 chipID = sdCfg.instance;
		DEV_GEN_CFG* devCfg = (DEV_GEN_CFG*)&sdCfg.cfgData[0];
		CHIP_DEVICE chipDev;
		DEV_INFO* devInf;
		const PLR_DEV_OPTS* devOpts;
		UINT8 retVal;
		
		memset(&chipDev, 0x00, sizeof(CHIP_DEVICE));
		devInf = &chipDev.base.defInf;
		
		sdCfg.deviceID = (size_t)-1;
		chipDev.vgmChipType = sdCfg.vgmChipType;
		chipDev.chipType = sdCfg.type;
		chipDev.chipID = chipID;
		chipDev.optID = _devOptMap[chipType][chipID];
		chipDev.cfgID = curChip;
		chipDev.base.defInf.dataPtr = NULL;
		chipDev.base.linkDev = NULL;
		
		devOpts = (chipDev.optID != (size_t)-1) ? &_devOpts[chipDev.optID] : NULL;
		devCfg->emuCore = (devOpts != NULL) ? devOpts->emuCore[0] : 0x00;
		devCfg->srMode = (devOpts != NULL) ? devOpts->srMode : DEVRI_SRMODE_NATIVE;
		if (devOpts != NULL && devOpts->smplRate)
			devCfg->smplRate = devOpts->smplRate;
		else
			devCfg->smplRate = _outSmplRate;
		
		switch(chipType)
		{
		case DEVID_SN76496:
			if ((chipID & 0x01) && devCfg->flags)	// must be 2nd chip + T6W28 mode
			{
				CHIP_DEVICE* otherDev = GetDevicePtr(sdCfg.vgmChipType, chipID ^ 0x01);
				if (otherDev != NULL)
				{
					SN76496_CFG* snCfg = (SN76496_CFG*)devCfg;
					// set pointer to other instance, for connecting both
					snCfg->t6w28_tone = otherDev->base.defInf.dataPtr;
					// ensure that both instances use the same core, as they are going to cross-reference each other
					snCfg->_genCfg.emuCore = otherDev->base.defInf.devDef->coreID;
				}
			}
			
			if (! devCfg->emuCore)
				devCfg->emuCore = FCC_MAME;
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			break;
		case DEVID_RF5C68:
			if (! devCfg->emuCore)
			{
				if (devCfg->flags == 1)	// RF5C164
					devCfg->emuCore = FCC_GENS;
				else //if (devCfg->flags == 0)	// RF5C68
					devCfg->emuCore = FCC_MAME;
			}
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_YM2610:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 'A', (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 'A', (void**)&chipDev.romWrite);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 'B', (void**)&chipDev.romSizeB);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 'B', (void**)&chipDev.romWriteB);
			break;
		case DEVID_YMF278B:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0x524F, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0x524F, (void**)&chipDev.romWrite);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0x5241, (void**)&chipDev.romSizeB);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0x5241, (void**)&chipDev.romWriteB);
			LoadOPL4ROM(&chipDev);
			break;
		case DEVID_32X_PWM:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			break;
		case DEVID_YMW258:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_C352:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D16, 0, (void**)&chipDev.writeM16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_QSOUND:
			chipDev.flags = 0x00;
			{
				UINT32 hdrClock = GetChipClock(sdCfg.vgmChipType, chipID) & ~0xC0000000;
				if (hdrClock < devCfg->clock)	// QSound VGMs with old (4 MHz) clock
					chipDev.flags |= 0x01;	// enable QSound hacks (required for proper playback of old VGMs)
			}
			if (! devCfg->emuCore)
				devCfg->emuCore = FCC_CTR_;
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_QUICKWRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			
			memset(&_qsWork[chipID], 0x00, sizeof(QSOUND_WORK));
			if (devInf->devDef->coreID == FCC_MAME)
				chipDev.flags &= ~0x01;	// MAME's old HLE doesn't need those hacks
			if (chipDev.writeD16 != NULL)
				_qsWork[chipID].write = &VGMPlayer::WriteQSound_A;
			else if (chipDev.write8 != NULL)
				_qsWork[chipID].write = &VGMPlayer::WriteQSound_B;
			else
				_qsWork[chipID].write = NULL;
			break;
		case DEVID_WSWAN:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			break;
		case DEVID_ES5506:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_SCSP:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D16, 0, (void**)&chipDev.writeM16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		default:
			if (chipType == DEVID_YM2612)
				chipDev.flags |= devCfg->flags;
			else if (chipType == DEVID_C219)
				chipDev.flags |= 0x01;	// enable 16-bit byteswap patch on all ROM data
			
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		}
		if (retVal)
		{
			devInf->dataPtr = NULL;
			devInf->devDef = NULL;
			continue;
		}
		sdCfg.deviceID = _devices.size();
		
		std::string devName = SndEmu_GetDevName(chipType, 0x00, devCfg);	// use short name for now
		if (GetChipCount(sdCfg.vgmChipType) > 1)
		{
			char postFix[0x10];
			snprintf(postFix, 0x10, " #%u", 1 + chipID);
			devName += postFix;
		}
		chipDev.logCbData.player = this;
		chipDev.logCbData.chipDevID = _devices.size();
		_devNames.push_back(devName);	// push here, so that we can have logs during SetupLinkedDevices()
		
		{
			DEVLINK_CB_DATA dlCbData;
			dlCbData.player = this;
			dlCbData.sdCfg = &sdCfg;
			dlCbData.chipDev = &chipDev;
			if (devInf->devDef->SetLogCB != NULL)	// allow for device link warnings
				devInf->devDef->SetLogCB(devInf->dataPtr, VGMPlayer::SndEmuLogCB, &chipDev.logCbData);
			SetupLinkedDevices(&chipDev.base, &DeviceLinkCallback, &dlCbData);
		}
		// already done by SndEmu_Start()
		//devInf->devDef->Reset(devInf->dataPtr);
		
		if (devOpts != NULL)
		{
			RefreshDevOptions(chipDev, *devOpts);
			RefreshMuting(chipDev, devOpts->muteOpts);
			RefreshPanning(chipDev, devOpts->panOpts);
		}
		if (devInf->linkDevCount > 0 && devInf->linkDevs[0].devID == DEVID_AY8910)
		{
			VGM_BASEDEV* clDev = chipDev.base.linkDev;
			size_t optID = DeviceID2OptionID(PLR_DEV_ID(DEVID_AY8910, chipID));
			if (optID != (size_t)-1 && clDev != NULL && clDev->defInf.devDef->SetOptionBits != NULL)
				clDev->defInf.devDef->SetOptionBits(devInf->dataPtr, _devOpts[optID].coreOpts);
		}

		_vdDevMap[sdCfg.vgmChipType][chipID] = _devices.size();
		if (chipDev.optID != (size_t)-1)
			_optDevMap[chipDev.optID] = _devices.size();
		_devices.push_back(chipDev);
	}	// end for (curChip)
	
	// Initializing the resampler has to be done separately due to reallocations happening above
	// and the memory address of the RESMPL_STATE mustn't change in order to allow callbacks from the devices.
	for (curChip = 0; curChip < _devices.size(); curChip ++)
	{
		CHIP_DEVICE& chipDev = _devices[curChip];
		DEV_INFO* devInf = &chipDev.base.defInf;
		const PLR_DEV_OPTS* devOpts = (chipDev.optID != (size_t)-1) ? &_devOpts[chipDev.optID] : NULL;
		VGM_BASEDEV* clDev;
		
		if (devInf->devDef->SetLogCB != NULL)
			devInf->devDef->SetLogCB(devInf->dataPtr, VGMPlayer::SndEmuLogCB, &chipDev.logCbData);
		
		UINT8 linkCntr = 0;
		for (clDev = &chipDev.base; clDev != NULL; clDev = clDev->linkDev, linkCntr ++)
		{
			UINT16 chipVol = GetChipVolume(chipDev.vgmChipType, chipDev.chipID, linkCntr);
			UINT8 resmplMode = (devOpts != NULL) ? devOpts->resmplMode : RSMODE_LINEAR;
			
			Resmpl_SetVals(&clDev->resmpl, resmplMode, chipVol, _outSmplRate);
			Resmpl_DevConnect(&clDev->resmpl, &clDev->defInf);
			Resmpl_Init(&clDev->resmpl);
		}
		
		if (chipDev.chipType == DEVID_YM3812)
		{
			if (GetChipClock(chipDev.vgmChipType, chipDev.chipID) & 0x80000000)
			{
				// Dual-OPL with Stereo - 1st chip is panned to the left, 2nd chip is panned to the right
				for (clDev = &chipDev.base; clDev != NULL; clDev = clDev->linkDev, linkCntr ++)
				{
					if (chipDev.chipID & 0x01)
					{
						clDev->resmpl.volumeL = 0x00;
						clDev->resmpl.volumeR *= 2;
					}
					else
					{
						clDev->resmpl.volumeL *= 2;
						clDev->resmpl.volumeR = 0x00;
					}
				}
			}
		}
	}
	
	NormalizeOverallVolume(EstimateOverallVolume());
	
	return;
}